

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ft_font_renderer.cpp
# Opt level: O2

GlyphMetrics * __thiscall
FtFontRenderer::getGlyphMetrics
          (GlyphMetrics *__return_storage_ptr__,FtFontRenderer *this,GlyphIndex glyphIdx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  FT_GlyphSlot_conflict pFVar3;
  int err;
  char32_t cp;
  FontRendererError *this_00;
  char *pcVar4;
  Size SVar5;
  Point PVar6;
  string local_68;
  string local_40;
  
  err = FT_Load_Glyph(this->face,glyphIdx,this->loadFlags);
  if (err == 0) {
    pFVar3 = this->face->glyph;
    __return_storage_ptr__->advance = (int)((ulong)(pFVar3->advance).x >> 6);
    if (pFVar3->format == FT_GLYPH_FORMAT_BITMAP) {
      uVar1 = (pFVar3->bitmap).rows;
      uVar2 = (pFVar3->bitmap).width;
      SVar5.h = uVar1;
      SVar5.w = uVar2;
      PVar6.x = pFVar3->bitmap_left;
      PVar6.y = pFVar3->bitmap_top;
    }
    else {
      FT_Outline_Get_CBox(&pFVar3->outline,&local_68);
      SVar5.h = (int)((local_68.field_2._8_8_ + 0x3f) - (local_68._M_string_length & 0x3fffffffc0)
                     >> 6);
      SVar5.w = (int)((local_68.field_2._M_allocated_capacity + 0x3f) -
                      ((ulong)local_68._M_dataplus._M_p & 0x3fffffffc0) >> 6);
      PVar6.y = (int)(local_68.field_2._8_8_ + 0x3f >> 6);
      PVar6.x = (int)((ulong)local_68._M_dataplus._M_p >> 6);
    }
    __return_storage_ptr__->size = SVar5;
    __return_storage_ptr__->offset = PVar6;
    return __return_storage_ptr__;
  }
  this_00 = (FontRendererError *)__cxa_allocate_exception(0x10);
  cp = idxToCp(this->face,glyphIdx);
  pcVar4 = dpfb::unicode::cpToStr(cp);
  ftErrorToStr_abi_cxx11_(&local_40,err);
  dpfb::str::format_abi_cxx11_
            (&local_68,"Can\'t load glyph for %s: %s",pcVar4,local_40._M_dataplus._M_p);
  dpfb::FontRendererError::runtime_error(this_00,&local_68);
  __cxa_throw(this_00,&dpfb::FontRendererError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

dpfb::GlyphMetrics FtFontRenderer::getGlyphMetrics(
    dpfb::GlyphIndex glyphIdx) const
{
    auto err = FT_Load_Glyph(face, glyphIdx, loadFlags);
    if (err != FT_Err_Ok)
        throw dpfb::FontRendererError(
            dpfb::str::format(
                "Can't load glyph for %s: %s",
                dpfb::unicode::cpToStr(idxToCp(face, glyphIdx)),
                ftErrorToStr(err).c_str()));

    dpfb::GlyphMetrics glyphMetrics;
    glyphMetrics.advance = face->glyph->advance.x >> 6;

    if (face->glyph->format == FT_GLYPH_FORMAT_BITMAP) {
        // Embedded bitmap
        glyphMetrics.size.w = static_cast<int>(face->glyph->bitmap.width);
        glyphMetrics.size.h = static_cast<int>(face->glyph->bitmap.rows);
        glyphMetrics.offset.x = face->glyph->bitmap_left;
        glyphMetrics.offset.y = face->glyph->bitmap_top;
    } else {
        FT_BBox bbox;
        FT_Outline_Get_CBox(&face->glyph->outline, &bbox);

        // See:
        //  FreeType Glyph Conventions
        //      VI. FreeType outlines
        //          3. Coordinates, scaling and grid-fitting
        // https://www.freetype.org/freetype2/docs/glyphs/glyphs-6.html

        bbox.xMin = ftFoor(bbox.xMin);
        bbox.xMax = ftCeil(bbox.xMax);
        bbox.yMin = ftFoor(bbox.yMin);
        bbox.yMax = ftCeil(bbox.yMax);

        glyphMetrics.size.w = (bbox.xMax - bbox.xMin) >> 6;
        glyphMetrics.size.h = (bbox.yMax - bbox.yMin) >> 6;
        glyphMetrics.offset.x = bbox.xMin >> 6;
        glyphMetrics.offset.y = bbox.yMax >> 6;
    }

    return glyphMetrics;
}